

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O3

void print_mem_ppr_status(igsc_ppr_status *sts)

{
  igsc_ppr_status *piVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  uint32_t *puVar5;
  
  puts("PPR status:");
  printf("Boot time memory correction pending: %u\n",(ulong)sts->boot_time_memory_correction_pending
        );
  if (sts->ppr_mode < 4) {
    printf("PPR mode: %s\n",gfsp_ppr_mode_str[(uint)sts->ppr_mode]);
  }
  else {
    printf("PPR mode: %u\n");
  }
  pcVar4 = "Test not executed";
  if ((sts->test_run_status & 1) == 0) {
    pcVar4 = "Test executed";
  }
  printf("Test run status: executed: %s\n",pcVar4);
  pcVar4 = "Error occurred during test execution";
  if ((sts->test_run_status & 2) == 0) {
    pcVar4 = "Test finished successfully";
  }
  printf("Test run status: finished successfully: %s\n",pcVar4);
  pcVar4 = "HW error found";
  if ((sts->test_run_status & 4) == 0) {
    pcVar4 = "HW error not found";
  }
  printf("Test run status: found hw error: %s\n",pcVar4);
  pcVar4 = "HW error is unrepairable";
  if ((sts->test_run_status & 8) == 0) {
    pcVar4 = "HW error repaired or no HW error found";
  }
  printf("Test run status: hw error repaired: %s\n",pcVar4);
  if ((ulong)sts->ras_ppr_applied < 3) {
    printf("RAS PPR test applied: %s\n",gfsp_ppr_applied_str[sts->ras_ppr_applied]);
  }
  else {
    printf("RAS PPR test applied: %u\n");
  }
  printf("mbist completed: %u\n",(ulong)sts->mbist_completed);
  printf("Number of PPR devices: %u\n",(ulong)sts->num_devices);
  if (sts->num_devices != 0) {
    puVar5 = &sts[1].mbist_completed;
    uVar3 = 0;
    do {
      printf("Device[%u]:\n",uVar3 & 0xffffffff);
      piVar1 = (igsc_ppr_status *)(puVar5 + -2);
      uVar2._0_1_ = piVar1->boot_time_memory_correction_pending;
      uVar2._1_1_ = piVar1->ppr_mode;
      uVar2._2_1_ = piVar1->test_run_status;
      uVar2._3_1_ = piVar1->reserved;
      printf("\t mbist test status: %u\n",(ulong)uVar2);
      printf("\t Number of PPR fuses used by fw: %u\n",(ulong)puVar5[-1]);
      printf("\t Number of remaining PPR fuses: %u\n",(ulong)*puVar5);
      uVar3 = uVar3 + 1;
      puVar5 = puVar5 + 3;
    } while (uVar3 < sts->num_devices);
  }
  return;
}

Assistant:

void print_mem_ppr_status(struct igsc_ppr_status *sts)
{
    printf("PPR status:\n");
    printf("Boot time memory correction pending: %u\n",
           sts->boot_time_memory_correction_pending);
    if (sizeof(gfsp_ppr_mode_str)/sizeof(char*) <= sts->ppr_mode)
        printf("PPR mode: %u\n", sts->ppr_mode);
    else
        printf("PPR mode: %s\n", gfsp_ppr_mode_str[sts->ppr_mode]);
    printf("Test run status: executed: %s\n",
           (sts->test_run_status & IGSC_PPR_STATUS_TEST_EXECUTED_MASK) ? "Test not executed" : "Test executed");
    printf("Test run status: finished successfully: %s\n",
           (sts->test_run_status & IGSC_PPR_STATUS_TEST_SUCCESS_MASK) ? "Error occurred during test execution" : "Test finished successfully");
    printf("Test run status: found hw error: %s\n",
           (sts->test_run_status & IGSC_PPR_STATUS_FOUND_HW_ERROR_MASK) ? "HW error found" : "HW error not found");
    printf("Test run status: hw error repaired: %s\n",
           (sts->test_run_status & IGSC_PPR_STATUS_HW_ERROR_REPAIRED_MASK) ? "HW error is unrepairable" : "HW error repaired or no HW error found");
    if (sizeof(gfsp_ppr_applied_str)/sizeof(char*) <= sts->ras_ppr_applied)
        printf("RAS PPR test applied: %u\n", sts->ras_ppr_applied);
    else
        printf("RAS PPR test applied: %s\n", gfsp_ppr_applied_str[sts->ras_ppr_applied]);
    printf("mbist completed: %u\n", sts->mbist_completed);
    printf("Number of PPR devices: %u\n", sts->num_devices);

    for (uint32_t i = 0; i < sts->num_devices; i++)
    {
        printf("Device[%u]:\n", i);
        printf("\t mbist test status: %u\n",
               sts->device_mbist_ppr_status[i].mbist_test_status);
        printf("\t Number of PPR fuses used by fw: %u\n",
               sts->device_mbist_ppr_status[i].num_of_ppr_fuses_used_by_fw);
        printf("\t Number of remaining PPR fuses: %u\n",
               sts->device_mbist_ppr_status[i].num_of_remaining_ppr_fuses);
    }
}